

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::Equals<int,int>(Assert *this,string *msg,int *expected,int *actual)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_210 [36];
  int local_1ec;
  expected_got_outputter_with_coercion<int,_int> local_1e8;
  int local_1d4;
  expected_got_outputter_with_coercion<int,_int> local_1d0 [2];
  expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  ostringstream local_1a8 [8];
  ostringstream s;
  int local_30;
  int local_2c;
  int *local_28;
  int *actual_local;
  int *expected_local;
  string *msg_local;
  Assert *this_local;
  
  local_2c = *expected;
  local_30 = *actual;
  local_28 = actual;
  actual_local = expected;
  expected_local = (int *)msg;
  msg_local = (string *)this;
  bVar1 = are_equal<int>(&local_2c,&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_1b0 = stream<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           expected_local);
    poVar3 = details::operator<<((ostream *)local_1a8,&local_1b0);
    std::operator<<(poVar3," ");
  }
  poVar3 = (ostream *)std::ostream::operator<<(local_1a8,std::boolalpha);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)local_1a8,"    Expected <");
  local_1d4 = *actual_local;
  local_1d0[0] = stream_with_coercion<int,int>(&local_1d4,actual_local);
  poVar3 = details::operator<<(poVar3,local_1d0);
  std::operator<<(poVar3,">\n");
  poVar3 = std::operator<<((ostream *)local_1a8,"     but got <");
  local_1ec = *local_28;
  local_1e8 = stream_with_coercion<int,int>(&local_1ec,local_28);
  poVar3 = details::operator<<(poVar3,&local_1e8);
  std::operator<<(poVar3,">\n");
  std::operator<<((ostream *)local_1a8,"  ");
  std::__cxx11::ostringstream::str();
  Error(this,local_210);
}

Assistant:

void Equals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (!are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha << "\n";
                s << "    Expected <" << stream_with_coercion(std::common_type_t<T, U>(expected), expected) << ">\n";
                s << "     but got <" << stream_with_coercion(std::common_type_t<T, U>(actual), actual) << ">\n";
                s << "  ";
                Error(s.str());
            }
        }